

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall
QTableWidget::setRangeSelected(QTableWidget *this,QTableWidgetSelectionRange *range,bool select)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)this);
  iVar1 = range->m_top;
  uVar2 = range->m_left;
  QAbstractItemView::rootIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
  cVar4 = QAbstractItemModel::hasIndex((int)pQVar5,iVar1,(QModelIndex *)(ulong)uVar2);
  if (cVar4 != '\0') {
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)this);
    iVar1 = range->m_bottom;
    uVar2 = range->m_right;
    QAbstractItemView::rootIndex((QModelIndex *)&local_78,(QAbstractItemView *)this);
    cVar4 = QAbstractItemModel::hasIndex((int)pQVar5,iVar1,(QModelIndex *)(ulong)uVar2);
    if (cVar4 != '\0') {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = QAbstractItemView::model((QAbstractItemView *)this);
      iVar1 = range->m_top;
      iVar3 = range->m_left;
      QAbstractItemView::rootIndex((QModelIndex *)&local_78,(QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_58,pQVar5,iVar1,iVar3,(QModelIndex *)&local_78);
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = QAbstractItemView::model((QAbstractItemView *)this);
      iVar1 = range->m_bottom;
      iVar3 = range->m_right;
      QAbstractItemView::rootIndex(&local_90,(QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar5 + 0x60))((QModelIndex *)&local_78,pQVar5,iVar1,iVar3,&local_90);
      pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      QItemSelection::QItemSelection
                ((QItemSelection *)&local_90,(QModelIndex *)&local_58,(QModelIndex *)&local_78);
      (**(code **)(*(long *)pQVar6 + 0x70))(pQVar6,&local_90,!select * '\x02' + '\x02');
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setRangeSelected(const QTableWidgetSelectionRange &range, bool select)
{
    if (!model()->hasIndex(range.topRow(), range.leftColumn(), rootIndex()) ||
        !model()->hasIndex(range.bottomRow(), range.rightColumn(), rootIndex()))
        return;

    QModelIndex topLeft = model()->index(range.topRow(), range.leftColumn(), rootIndex());
    QModelIndex bottomRight = model()->index(range.bottomRow(), range.rightColumn(), rootIndex());

    selectionModel()->select(QItemSelection(topLeft, bottomRight),
                             select ? QItemSelectionModel::Select : QItemSelectionModel::Deselect);
}